

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imtui-demo.cpp
# Opt level: O2

int __thiscall
ExampleAppConsole::TextEditCallback(ExampleAppConsole *this,ImGuiInputTextCallbackData *data)

{
  int iVar1;
  uint uVar2;
  bool bVar3;
  char **ppcVar4;
  ulong uVar5;
  char *pcVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  char *str2;
  long lVar11;
  int c;
  int i;
  long lVar12;
  char *pcVar13;
  ImVector<const_char_*> candidates;
  
  if (data->EventFlag != 0x80) {
    if (data->EventFlag != 0x40) {
      return 0;
    }
    pcVar13 = data->Buf;
    iVar1 = data->CursorPos;
    pcVar6 = pcVar13 + iVar1;
    uVar2 = 0;
    do {
      uVar8 = uVar2;
      str2 = pcVar6;
      if (str2 <= pcVar13) break;
      pcVar6 = str2 + -1;
      uVar2 = uVar8 + 1;
    } while ((0x3b < (ulong)(byte)str2[-1]) ||
            ((0x800100100000200U >> ((ulong)(byte)str2[-1] & 0x3f) & 1) == 0));
    candidates.Size = 0;
    candidates.Capacity = 0;
    candidates.Data = (char **)0x0;
    lVar11 = 0;
    for (lVar12 = 0; ppcVar4 = candidates.Data, lVar12 < (this->Commands).Size; lVar12 = lVar12 + 1)
    {
      iVar7 = Strnicmp(*(char **)((long)(this->Commands).Data + lVar11),str2,uVar8);
      if (iVar7 == 0) {
        ImVector<const_char_*>::push_back
                  (&candidates,(char **)((long)(this->Commands).Data + lVar11));
      }
      lVar11 = lVar11 + 8;
    }
    lVar11 = (long)candidates.Size;
    if (lVar11 == 0) {
      AddLog(this,"No match for \"%.*s\"!\n",(ulong)uVar8,str2);
    }
    else if (candidates.Size == 1) {
      ImGuiInputTextCallbackData::DeleteChars
                (data,(((int)pcVar13 + iVar1) - *(int *)&data->Buf) - uVar8,uVar8);
      ImGuiInputTextCallbackData::InsertChars(data,data->CursorPos,*candidates.Data,(char *)0x0);
      ImGuiInputTextCallbackData::InsertChars(data,data->CursorPos," ",(char *)0x0);
    }
    else {
      uVar5 = (long)(int)uVar8;
      do {
        uVar10 = uVar5;
        bVar3 = true;
        lVar12 = 0;
        iVar7 = 0;
        while ((lVar12 < lVar11 && (bVar3))) {
          if (lVar12 == 0) {
            iVar7 = toupper((int)(*ppcVar4)[uVar10]);
            bVar3 = true;
          }
          else {
            if (iVar7 != 0) {
              iVar9 = toupper((int)ppcVar4[lVar12][uVar10]);
              bVar3 = true;
              if (iVar7 == iVar9) goto LAB_00117656;
            }
            bVar3 = false;
          }
LAB_00117656:
          lVar12 = lVar12 + 1;
        }
        uVar5 = uVar10 + 1;
      } while (bVar3);
      if (0 < (long)uVar10) {
        ImGuiInputTextCallbackData::DeleteChars
                  (data,(((int)pcVar13 + iVar1) - *(int *)&data->Buf) - uVar8,uVar8);
        ImGuiInputTextCallbackData::InsertChars
                  (data,data->CursorPos,*candidates.Data,*candidates.Data + (uVar10 & 0xffffffff));
      }
      AddLog(this,"Possible matches:\n");
      for (lVar11 = 0; lVar11 < candidates.Size; lVar11 = lVar11 + 1) {
        AddLog(this,"- %s\n",candidates.Data[lVar11]);
      }
    }
    ImVector<const_char_*>::~ImVector(&candidates);
    return 0;
  }
  uVar2 = this->HistoryPos;
  if (data->EventKey == 4) {
    if (uVar2 == 0xffffffff) {
      return 0;
    }
    uVar8 = 0xffffffff;
    if ((int)(uVar2 + 1) < (this->History).Size) {
      uVar8 = uVar2 + 1;
    }
LAB_001176f6:
    this->HistoryPos = uVar8;
    if (uVar2 == uVar8) {
      return 0;
    }
    if ((int)uVar8 < 0) {
      pcVar13 = "";
      goto LAB_0011771f;
    }
  }
  else {
    if (data->EventKey != 3) {
      return 0;
    }
    if (uVar2 == 0xffffffff) {
      uVar8 = (this->History).Size - 1;
      goto LAB_001176f6;
    }
    if ((int)uVar2 < 1) {
      return 0;
    }
    uVar8 = uVar2 - 1;
    this->HistoryPos = uVar8;
  }
  pcVar13 = (this->History).Data[uVar8];
LAB_0011771f:
  ImGuiInputTextCallbackData::DeleteChars(data,0,data->BufTextLen);
  ImGuiInputTextCallbackData::InsertChars(data,0,pcVar13,(char *)0x0);
  return 0;
}

Assistant:

int     TextEditCallback(ImGuiInputTextCallbackData* data)
    {
        //AddLog("cursor: %d, selection: %d-%d", data->CursorPos, data->SelectionStart, data->SelectionEnd);
        switch (data->EventFlag)
        {
        case ImGuiInputTextFlags_CallbackCompletion:
            {
                // Example of TEXT COMPLETION

                // Locate beginning of current word
                const char* word_end = data->Buf + data->CursorPos;
                const char* word_start = word_end;
                while (word_start > data->Buf)
                {
                    const char c = word_start[-1];
                    if (c == ' ' || c == '\t' || c == ',' || c == ';')
                        break;
                    word_start--;
                }

                // Build a list of candidates
                ImVector<const char*> candidates;
                for (int i = 0; i < Commands.Size; i++)
                    if (Strnicmp(Commands[i], word_start, (int)(word_end-word_start)) == 0)
                        candidates.push_back(Commands[i]);

                if (candidates.Size == 0)
                {
                    // No match
                    AddLog("No match for \"%.*s\"!\n", (int)(word_end-word_start), word_start);
                }
                else if (candidates.Size == 1)
                {
                    // Single match. Delete the beginning of the word and replace it entirely so we've got nice casing
                    data->DeleteChars((int)(word_start-data->Buf), (int)(word_end-word_start));
                    data->InsertChars(data->CursorPos, candidates[0]);
                    data->InsertChars(data->CursorPos, " ");
                }
                else
                {
                    // Multiple matches. Complete as much as we can, so inputing "C" will complete to "CL" and display "CLEAR" and "CLASSIFY"
                    int match_len = (int)(word_end - word_start);
                    for (;;)
                    {
                        int c = 0;
                        bool all_candidates_matches = true;
                        for (int i = 0; i < candidates.Size && all_candidates_matches; i++)
                            if (i == 0)
                                c = toupper(candidates[i][match_len]);
                            else if (c == 0 || c != toupper(candidates[i][match_len]))
                                all_candidates_matches = false;
                        if (!all_candidates_matches)
                            break;
                        match_len++;
                    }

                    if (match_len > 0)
                    {
                        data->DeleteChars((int)(word_start - data->Buf), (int)(word_end-word_start));
                        data->InsertChars(data->CursorPos, candidates[0], candidates[0] + match_len);
                    }

                    // List matches
                    AddLog("Possible matches:\n");
                    for (int i = 0; i < candidates.Size; i++)
                        AddLog("- %s\n", candidates[i]);
                }

                break;
            }
        case ImGuiInputTextFlags_CallbackHistory:
            {
                // Example of HISTORY
                const int prev_history_pos = HistoryPos;
                if (data->EventKey == ImGuiKey_UpArrow)
                {
                    if (HistoryPos == -1)
                        HistoryPos = History.Size - 1;
                    else if (HistoryPos > 0)
                        HistoryPos--;
                }
                else if (data->EventKey == ImGuiKey_DownArrow)
                {
                    if (HistoryPos != -1)
                        if (++HistoryPos >= History.Size)
                            HistoryPos = -1;
                }

                // A better implementation would preserve the data on the current input line along with cursor position.
                if (prev_history_pos != HistoryPos)
                {
                    const char* history_str = (HistoryPos >= 0) ? History[HistoryPos] : "";
                    data->DeleteChars(0, data->BufTextLen);
                    data->InsertChars(0, history_str);
                }
            }
        }
        return 0;
    }